

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  ~Ifc2DCompositeCurve
            ((Ifc2DCompositeCurve *)
             ((long)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                     super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper +
             *(long *)((long)(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
                             super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper + -0x18)));
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}